

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EventListControl * __thiscall
slang::BumpAllocator::
emplace<slang::ast::EventListControl,std::span<slang::ast::TimingControl_const*const,18446744073709551615ul>,slang::SourceRange_const&>
          (BumpAllocator *this,
          span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *args,
          SourceRange *args_1)

{
  pointer ppTVar1;
  size_t sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  EventListControl *pEVar5;
  
  pEVar5 = (EventListControl *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EventListControl *)this->endPtr < pEVar5 + 1) {
    pEVar5 = (EventListControl *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pEVar5 + 1);
  }
  ppTVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  SVar3 = args_1->startLoc;
  SVar4 = args_1->endLoc;
  (pEVar5->super_TimingControl).kind = EventList;
  (pEVar5->super_TimingControl).syntax = (SyntaxNode *)0x0;
  (pEVar5->super_TimingControl).sourceRange.startLoc = SVar3;
  (pEVar5->super_TimingControl).sourceRange.endLoc = SVar4;
  (pEVar5->events)._M_ptr = ppTVar1;
  (pEVar5->events)._M_extent._M_extent_value = sVar2;
  return pEVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }